

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

Var __thiscall
Js::JSONStringifier::ReadValue
          (JSONStringifier *this,JavascriptString *key,PropertyRecord *propertyRecord,
          RecyclableObject *holder)

{
  bool bVar1;
  uint32 index;
  BOOL BVar2;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  undefined4 extraout_var;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  PropertyRecord *propertyRecord_local;
  Var value;
  PropertyRecord *pPVar3;
  
  propertyRecord_local = (PropertyRecord *)0x0;
  local_80 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  info._56_8_ = propertyRecord;
  if (propertyRecord == (PropertyRecord *)0x0) {
    (*(key->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x61])(key,&info.inlineCacheIndex,0);
  }
  if (*(char *)(info._56_8_ + 0x10) == '\x01') {
    index = PropertyRecord::GetNumericValue((PropertyRecord *)info._56_8_);
    JavascriptOperators::GetItem(holder,index,&propertyRecord_local,this->scriptContext);
    return propertyRecord_local;
  }
  bVar1 = VarIsImpl<Js::PropertyString>(&key->super_RecyclableObject);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(key);
  }
  else {
    this_00 = (PropertyString *)0x0;
  }
  if (this_00 != (PropertyString *)0x0) {
    polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
    propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_80,(RecyclableObject *)this_00,propertyRecordUsageCache,
               polymorphicInlineCache,false);
    bVar1 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,false,false>
                      (&this_00->propertyRecordUsageCache,holder,holder,&propertyRecord_local,
                       this->scriptContext,(PropertyValueInfo *)local_80,(RecyclableObject *)this_00
                       ,(PropertyCacheOperationInfo *)0x0);
    if (bVar1) {
      bVar1 = false;
      pPVar3 = propertyRecord_local;
      goto LAB_00b757dd;
    }
  }
  BVar2 = JavascriptOperators::GetProperty
                    (holder,*(PropertyId *)(info._56_8_ + 8),&propertyRecord_local,
                     this->scriptContext,(PropertyValueInfo *)local_80);
  pPVar3 = (PropertyRecord *)CONCAT44(extraout_var,BVar2);
  bVar1 = true;
LAB_00b757dd:
  if (bVar1) {
    return propertyRecord_local;
  }
  return pPVar3;
}

Assistant:

_Ret_notnull_ Var
JSONStringifier::ReadValue(_In_ JavascriptString* key, _In_opt_ const PropertyRecord* propertyRecord, _In_ RecyclableObject* holder)
{
    Var value = nullptr;
    PropertyValueInfo info;

    if (propertyRecord == nullptr)
    {
        key->GetPropertyRecord(&propertyRecord);
    }

    if (propertyRecord->IsNumeric())
    {
        JavascriptOperators::GetItem(holder, propertyRecord->GetNumericValue(), &value, this->scriptContext);
    }
    else
    {
        PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(key);
        if (propertyString != nullptr)
        {
            PropertyValueInfo::SetCacheInfo(&info, propertyString, propertyString->GetLdElemInlineCache(), false);
            if (propertyString->TryGetPropertyFromCache<false /* ownPropertyOnly */, false /* OutputExistence */>(holder, holder, &value, this->scriptContext, &info))
            {
                return value;
            }
        }
        JavascriptOperators::GetProperty(holder, propertyRecord->GetPropertyId(), &value, this->scriptContext, &info);
    }

    return value;
}